

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

SharedExNdPtr __thiscall front::syntax::SyntaxAnalyze::gm_mul_exp(SyntaxAnalyze *this)

{
  OperationType OVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  SharedExNdPtr SVar6;
  SyntaxAnalyze *in_stack_000000f8;
  string tmpName;
  Op op;
  SharedExNdPtr father;
  SharedExNdPtr second;
  SharedExNdPtr *first;
  element_type *in_stack_fffffffffffffe58;
  ExpressNode *in_stack_fffffffffffffe60;
  element_type *in_stack_fffffffffffffe68;
  SyntaxAnalyze *in_stack_fffffffffffffe70;
  undefined1 *in_stack_fffffffffffffe78;
  SyntaxAnalyze *in_stack_fffffffffffffe80;
  undefined1 local_110 [32];
  undefined1 local_f0 [64];
  string local_b0 [4];
  Op in_stack_ffffffffffffff54;
  __node_base in_stack_ffffffffffffff58;
  SharedExNdPtr *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  SyntaxAnalyze *in_stack_ffffffffffffff70;
  Token in_stack_ffffffffffffffcc;
  SyntaxAnalyze *in_stack_ffffffffffffffd0;
  TyKind in_stack_ffffffffffffffe4;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar7;
  
  uVar7 = 0;
  std::shared_ptr<front::express::ExpressNode>::shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2a60e7);
  gm_unary_exp(in_stack_000000f8);
  std::shared_ptr<front::express::ExpressNode>::operator=
            ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe60,
             (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe58);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2a6120);
  while (bVar4 = try_word(in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                          (Token)in_stack_fffffffffffffe78,
                          (Token)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                          (Token)in_stack_fffffffffffffe70), bVar4) {
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2a6162);
    operator_new(0x48);
    express::ExpressNode::ExpressNode((ExpressNode *)in_stack_fffffffffffffe80);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr<front::express::ExpressNode,void>
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe60,
               in_stack_fffffffffffffe58);
    bVar4 = try_word(in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                     (Token)in_stack_fffffffffffffe68);
    if (bVar4) {
      match_one_word(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a61de);
      peVar5->_operation = MUL;
    }
    else {
      bVar4 = try_word(in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                       (Token)in_stack_fffffffffffffe68);
      if (bVar4) {
        match_one_word(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        peVar5 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a62b0);
        peVar5->_operation = DIV;
      }
      else {
        match_one_word(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        peVar5 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a62e5);
        peVar5->_operation = MOD;
      }
    }
    gm_unary_exp(in_stack_000000f8);
    std::shared_ptr<front::express::ExpressNode>::operator=
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe60,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe58);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2a6332);
    peVar5 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2a633f);
    if ((peVar5->_type == CNS) &&
       (peVar5 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a6355), peVar5->_type == CNS)) {
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a6370);
      peVar5->_type = CNS;
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a6380);
      OVar1 = peVar5->_operation;
      if (OVar1 == MUL) {
        peVar5 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a63b8);
        iVar2 = peVar5->_value;
        peVar5 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a63cc);
        iVar3 = peVar5->_value;
        peVar5 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a63e8);
        peVar5->_value = iVar2 * iVar3;
      }
      else if (OVar1 == DIV) {
        peVar5 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a6401);
        iVar2 = peVar5->_value;
        peVar5 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a6415);
        iVar3 = peVar5->_value;
        peVar5 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a6431);
        peVar5->_value = iVar2 / iVar3;
      }
      else if (OVar1 == MOD) {
        peVar5 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a6447);
        iVar2 = peVar5->_value;
        peVar5 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a645b);
        iVar3 = peVar5->_value;
        peVar5 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a6477);
        peVar5->_value = iVar2 % iVar3;
      }
    }
    else {
      std::__cxx11::string::string((string *)&stack0xffffffffffffff70);
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                ((irGenerator *)CONCAT17(uVar7,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4)
      ;
      std::__cxx11::string::operator=((string *)&stack0xffffffffffffff70,local_b0);
      std::__cxx11::string::~string(local_b0);
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a64ec);
      peVar5->_type = VAR;
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a64fc);
      std::__cxx11::string::operator=((string *)&peVar5->_name,(string *)&stack0xffffffffffffff70);
      std::__cxx11::string::string((string *)(local_f0 + 0x20),(string *)&stack0xffffffffffffff70);
      in_stack_fffffffffffffe78 = local_f0 + 0x10;
      std::shared_ptr<front::express::ExpressNode>::shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe60,
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe80 = (SyntaxAnalyze *)local_f0;
      std::shared_ptr<front::express::ExpressNode>::shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe60,
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe58);
      hp_gn_binary_mir(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60
                       ,(SharedExNdPtr *)in_stack_ffffffffffffff58._M_nxt,in_stack_ffffffffffffff54)
      ;
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2a6590);
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2a659d);
      std::__cxx11::string::~string((string *)(local_f0 + 0x20));
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    }
    in_stack_fffffffffffffe68 =
         std::
         __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2a6629);
    in_stack_fffffffffffffe70 = (SyntaxAnalyze *)(local_110 + 0x10);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe60,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe58);
    express::ExpressNode::addChild
              (in_stack_fffffffffffffe60,(SharedExNdPtr *)in_stack_fffffffffffffe58);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2a6666);
    in_stack_fffffffffffffe58 =
         std::
         __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2a6673);
    in_stack_fffffffffffffe60 = (ExpressNode *)local_110;
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe60,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe58);
    express::ExpressNode::addChild
              (in_stack_fffffffffffffe60,(SharedExNdPtr *)in_stack_fffffffffffffe58);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2a66ae);
    std::shared_ptr<front::express::ExpressNode>::operator=
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe60,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe58);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2a66d0);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2a66dd);
  }
  SVar6.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  SVar6.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SharedExNdPtr)
         SVar6.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedExNdPtr SyntaxAnalyze::gm_mul_exp() {
  SharedExNdPtr first;
  first = gm_unary_exp();

  while (try_word(1, Token::MULT, Token::DIV, Token::MOD)) {
    SharedExNdPtr second;
    SharedExNdPtr father(new ExpressNode());
    Op op;

    if (try_word(1, Token::MULT)) {
      match_one_word(Token::MULT);
      father->_operation = OperationType::MUL;
      op = Op::Mul;
    } else if (try_word(1, Token::DIV)) {
      match_one_word(Token::DIV);
      father->_operation = OperationType::DIV;
      op = Op::Div;
    } else {
      match_one_word(Token::MOD);
      father->_operation = OperationType::MOD;
      op = Op::Rem;
    }

    second = gm_unary_exp();

    if (first->_type == NodeType::CNS && second->_type == NodeType::CNS) {
      father->_type = NodeType::CNS;
      switch (father->_operation) {
        case OperationType::MUL:
          father->_value = first->_value * second->_value;
          break;
        case OperationType::DIV:
          father->_value = first->_value / second->_value;
          break;
        case OperationType::MOD:
          father->_value = first->_value % second->_value;
          break;
        default:
          break;
      }
    } else {
      string tmpName;

      tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
      father->_type = NodeType::VAR;
      father->_name = tmpName;

      hp_gn_binary_mir(tmpName, first, second, op);
    }
    father->addChild(first);
    father->addChild(second);
    first = father;
  }
  return first;
}